

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall
SBarInfoCommandFlowControl::SetTruth
          (SBarInfoCommandFlowControl *this,bool truth,SBarInfoMainBlock *block,DSBarInfo *statusBar
          )

{
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  bool truth_local;
  SBarInfoCommandFlowControl *this_local;
  
  if (((bool)(this->truth & 1U) != truth) &&
     (this->truth = truth, block != (SBarInfoMainBlock *)0x0)) {
    (*(this->super_SBarInfoCommand)._vptr_SBarInfoCommand[5])(this,block,statusBar,1);
  }
  return;
}

Assistant:

void	SetTruth(bool truth, const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			// If there is no change we don't need to do anything.  Do note
			// that this should not change more than once per tick.  If it does
			// there may be cosmetic problems.
			if(this->truth == truth)
				return;

			this->truth = truth;
			if(block != NULL)
				Tick(block, statusBar, true);
		}